

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O0

void gen_set_cr1_from_fpscr(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i32 ret;
  TCGv_i32 tmp;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx_00);
  tcg_gen_extrl_i64_i32_ppc64(tcg_ctx_00,ret,cpu_fpscr);
  tcg_gen_shri_i32_ppc64(tcg_ctx_00,cpu_crf[1],ret,0x1c);
  tcg_temp_free_i32(tcg_ctx_00,ret);
  return;
}

Assistant:

static void gen_set_cr1_from_fpscr(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_trunc_tl_i32(tcg_ctx, tmp, cpu_fpscr);
    tcg_gen_shri_i32(tcg_ctx, cpu_crf[1], tmp, 28);
    tcg_temp_free_i32(tcg_ctx, tmp);
}